

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

int __thiscall ImFontAtlas::CustomRectRegister(ImFontAtlas *this,uint id,int width,int height)

{
  value_type local_14;
  
  if (0xfffe < width - 1U) {
    __assert_fail("width > 0 && width <= 0xFFFF",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/dependencies/imgui/imgui_draw.cpp"
                  ,0x529,"int ImFontAtlas::CustomRectRegister(unsigned int, int, int)");
  }
  if (height - 1U < 0xffff) {
    local_14.X = 0xffff;
    local_14.Y = 0xffff;
    local_14.Width = (unsigned_short)width;
    local_14.Height = (unsigned_short)height;
    local_14.ID = id;
    ImVector<ImFontAtlas::CustomRect>::push_back(&this->CustomRects,&local_14);
    return (this->CustomRects).Size + -1;
  }
  __assert_fail("height > 0 && height <= 0xFFFF",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/dependencies/imgui/imgui_draw.cpp"
                ,0x52a,"int ImFontAtlas::CustomRectRegister(unsigned int, int, int)");
}

Assistant:

int ImFontAtlas::CustomRectRegister(unsigned int id, int width, int height)
{
    IM_ASSERT(width > 0 && width <= 0xFFFF);
    IM_ASSERT(height > 0 && height <= 0xFFFF);
    CustomRect r;
    r.ID = id;
    r.Width = (unsigned short)width;
    r.Height = (unsigned short)height;
    CustomRects.push_back(r);
    return CustomRects.Size - 1; // Return index
}